

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

IndexPropertyDescriptorMap * __thiscall
Js::IndexPropertyDescriptorMap::Clone(IndexPropertyDescriptorMap *this,Recycler *recycler)

{
  Recycler *alloc;
  IndexPropertyDescriptorMap *this_00;
  TrackAllocData local_40;
  Recycler *local_18;
  Recycler *recycler_local;
  IndexPropertyDescriptorMap *this_local;
  
  local_18 = recycler;
  recycler_local = (Recycler *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
             ,0x1a);
  alloc = Memory::Recycler::TrackAllocInfo(recycler,&local_40);
  this_00 = (IndexPropertyDescriptorMap *)new<Memory::Recycler>(0x20,alloc,0x43c4b0);
  IndexPropertyDescriptorMap(this_00,local_18,this);
  return this_00;
}

Assistant:

IndexPropertyDescriptorMap * IndexPropertyDescriptorMap::Clone(Recycler * recycler)
    {
        return RecyclerNew(recycler, IndexPropertyDescriptorMap, recycler, this);
    }